

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegdec.c
# Opt level: O2

int ReadJPEG(uint8_t *data,size_t data_size,WebPPicture *pic,int keep_alpha,Metadata *metadata)

{
  byte bVar1;
  JOCTET *pJVar2;
  void *__s2;
  JDIMENSION JVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  uint8_t *puVar7;
  uint uVar8;
  jpeg_saved_marker_ptr_conflict pjVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  char *__format;
  size_t __size;
  uint uVar13;
  uint uVar14;
  uint64_t stride;
  long lVar15;
  long lVar16;
  size_t sVar17;
  int ok;
  uint8_t *rgb;
  uint8_t *local_1c70;
  jpeg_source_mgr local_1c68;
  uint8_t *local_1c30;
  size_t local_1c28;
  jpeg_decompress_struct dinfo;
  my_error_mgr jerr;
  unsigned_long local_1818;
  size_t sStack_1810;
  undefined4 auStack_1808 [1526];
  
  rgb = (uint8_t *)0x0;
  if (pic == (WebPPicture *)0x0 || (data_size == 0 || data == (uint8_t *)0x0)) {
    return 0;
  }
  local_1c68.skip_input_data = (_func_void_j_decompress_ptr_long *)0x0;
  local_1c68.resync_to_restart = (_func_boolean_j_decompress_ptr_int *)0x0;
  local_1c68.term_source = (_func_void_j_decompress_ptr *)0x0;
  local_1c68.init_source = (_func_void_j_decompress_ptr *)0x0;
  local_1c68.fill_input_buffer = (_func_boolean_j_decompress_ptr *)0x0;
  local_1c68.next_input_byte = (JOCTET *)0x0;
  local_1c68.bytes_in_buffer = 0;
  local_1c30 = data;
  local_1c28 = data_size;
  memset(&dinfo,0,0x290);
  dinfo.err = (jpeg_error_mgr *)jpeg_std_error(&jerr);
  jerr.pub.error_exit = my_error_exit;
  iVar5 = _setjmp((__jmp_buf_tag *)jerr.setjmp_buffer);
  if (iVar5 == 0) {
    jpeg_CreateDecompress(&dinfo,0x50,0x290);
    dinfo.src = &local_1c68;
    local_1c68.init_source = ContextInit;
    local_1c68.fill_input_buffer = ContextFill;
    local_1c68.skip_input_data = ContextSkip;
    local_1c68.resync_to_restart = jpeg_resync_to_restart;
    local_1c68.term_source = ContextTerm;
    local_1c68.next_input_byte = (JOCTET *)0x0;
    local_1c68.bytes_in_buffer = 0;
    if (metadata != (Metadata *)0x0) {
      jpeg_save_markers(&dinfo,0xe1,0xffff);
      jpeg_save_markers(&dinfo,0xe2,0xffff);
    }
    jpeg_read_header(&dinfo,1);
    dinfo.out_color_space = JCS_RGB;
    dinfo.do_fancy_upsampling = 1;
    jpeg_start_decompress(&dinfo);
    JVar3 = dinfo.output_height;
    if (dinfo.output_components == 3) {
      stride = (ulong)dinfo.output_width * 3;
      if ((long)(int)stride == stride) {
        sVar17 = (size_t)(int)dinfo.output_height;
        iVar5 = ImgIoUtilCheckSizeArgumentsOverflow(stride,sVar17);
        if ((iVar5 != 0) && (rgb = (uint8_t *)malloc(sVar17 * stride), rgb != (uint8_t *)0x0)) {
          local_1c70 = rgb;
          while (dinfo.output_scanline < dinfo.output_height) {
            iVar5 = jpeg_read_scanlines(&dinfo,&local_1c70,1);
            if (iVar5 != 1) goto LAB_00104812;
            local_1c70 = local_1c70 + stride;
          }
          if (metadata != (Metadata *)0x0) {
            memset(&local_1818,0,0x17e8);
            pjVar9 = (jpeg_saved_marker_ptr_conflict)&dinfo.marker_list;
            __size = 0;
            uVar14 = 0;
            uVar8 = 0;
            uVar11 = 0;
            while (pjVar9 = pjVar9->next, pjVar9 != (jpeg_saved_marker_ptr_conflict)0x0) {
              if ((pjVar9->marker == 0xe2) && (uVar13 = pjVar9->data_length, 0xe < (ulong)uVar13)) {
                pJVar2 = pjVar9->data;
                iVar5 = bcmp(pJVar2,"ICC_PROFILE",0xc);
                if (iVar5 == 0) {
                  bVar1 = pJVar2[0xc];
                  uVar6 = (ulong)uVar13 - 0xe;
                  if ((pJVar2[0xd] == 0) || (bVar1 == 0)) {
                    fprintf(stderr,
                            "[ICCP] size (%d) / count (%d) / sequence number (%d) cannot be 0!\n",
                            uVar6 & 0xffffffff);
                    goto LAB_00104795;
                  }
                  uVar13 = (uint)pJVar2[0xd];
                  uVar10 = uVar13;
                  if ((uVar8 != 0) && (uVar10 = uVar8, uVar8 != uVar13)) {
                    __format = "[ICCP] Inconsistent segment count (%d / %d)!\n";
                    uVar11 = uVar8;
                    goto LAB_0010478e;
                  }
                  uVar12 = (ulong)(uint)bVar1;
                  if (jerr.setjmp_buffer[0].__saved_mask.__val[uVar12 * 3 + 0xe] != 0) {
                    fprintf(stderr,"[ICCP] Duplicate segment number (%d)!\n",(ulong)(uint)bVar1);
                    goto LAB_00104795;
                  }
                  jerr.setjmp_buffer[0].__saved_mask.__val[uVar12 * 3 + 0xd] =
                       (unsigned_long)(pJVar2 + 0xe);
                  jerr.setjmp_buffer[0].__saved_mask.__val[uVar12 * 3 + 0xe] = uVar6;
                  __size = __size + uVar6;
                  uVar8 = (uint)bVar1;
                  uVar13 = uVar8;
                  if (uVar8 < uVar11) {
                    uVar13 = uVar11;
                  }
                  *(uint *)(jerr.setjmp_buffer[0].__saved_mask.__val + uVar12 * 3 + 0xf) = uVar8;
                  uVar14 = uVar14 + 1;
                  uVar8 = uVar10;
                  uVar11 = uVar13;
                }
              }
            }
            if (uVar14 == 0) {
LAB_00104686:
              pjVar9 = (jpeg_saved_marker_ptr_conflict)&dinfo.marker_list;
              while (pjVar9 = pjVar9->next, pjVar9 != (jpeg_saved_marker_ptr_conflict)0x0) {
                for (lVar16 = 0; lVar16 != 0x40; lVar16 = lVar16 + 0x20) {
                  if (*(uint *)((long)&ExtractMetadataFromJPEG_kJPEGMetadataMap + lVar16) ==
                      (uint)pjVar9->marker) {
                    uVar6 = *(ulong *)((long)&DAT_001eab60 + lVar16);
                    sVar17 = pjVar9->data_length - uVar6;
                    if (uVar6 <= pjVar9->data_length && sVar17 != 0) {
                      pJVar2 = pjVar9->data;
                      __s2 = *(void **)((long)&PTR_anon_var_dwarf_1474_001eab58 + lVar16);
                      iVar5 = bcmp(pJVar2,__s2,uVar6);
                      if (iVar5 == 0) {
                        if (*(long *)((long)&(metadata->exif).bytes +
                                     *(long *)((long)&DAT_001eab68 + lVar16)) == 0) {
                          iVar5 = MetadataCopy((char *)(pJVar2 + uVar6),sVar17,
                                               (MetadataPayload *)
                                               ((long)&(metadata->exif).bytes +
                                               *(long *)((long)&DAT_001eab68 + lVar16)));
                          if (iVar5 == 0) goto LAB_00104795;
                        }
                        else {
                          fprintf(stderr,"Ignoring additional \'%s\' marker\n",__s2);
                        }
                      }
                    }
                  }
                }
              }
              bVar4 = true;
            }
            else {
              if (uVar11 == uVar14) {
                if (uVar8 == uVar11) {
                  qsort(&local_1818,(ulong)uVar11,0x18,CompareICCPSegments);
                  puVar7 = (uint8_t *)malloc(__size);
                  (metadata->iccp).bytes = puVar7;
                  if (puVar7 != (uint8_t *)0x0) {
                    (metadata->iccp).size = __size;
                    lVar15 = 0;
                    for (lVar16 = lVar15; (ulong)uVar11 * 0x18 - lVar16 != 0; lVar16 = lVar16 + 0x18
                        ) {
                      memcpy((metadata->iccp).bytes + lVar15,*(void **)((long)&local_1818 + lVar16),
                             *(size_t *)((long)auStack_1808 + lVar16 + -8));
                      lVar15 = lVar15 + *(long *)((long)auStack_1808 + lVar16 + -8);
                    }
                    goto LAB_00104686;
                  }
                }
                else {
                  __format = "[ICCP] Segment count: %d does not match expected: %d!\n";
                  uVar13 = uVar8;
LAB_0010478e:
                  fprintf(stderr,__format,(ulong)uVar11,(ulong)uVar13);
                }
              }
              else {
                fprintf(stderr,"[ICCP] Discontinuous segments, expected: %d actual: %d!\n");
              }
LAB_00104795:
              bVar4 = false;
            }
            if (!bVar4) {
              fwrite("Error extracting JPEG metadata!\n",0x20,1,stderr);
              goto LAB_00104812;
            }
          }
          jpeg_finish_decompress(&dinfo);
          jpeg_destroy_decompress(&dinfo);
          pic->width = dinfo.output_width;
          pic->height = JVar3;
          ok = WebPPictureImportRGB(pic,rgb,(int)stride);
          if (ok == 0) {
            pic->width = 0;
            pic->height = 0;
            MetadataFree(metadata);
          }
          goto LAB_00104827;
        }
      }
    }
  }
LAB_00104812:
  ok = 0;
  MetadataFree(metadata);
  jpeg_destroy_decompress(&dinfo);
LAB_00104827:
  free(rgb);
  return ok;
}

Assistant:

int ReadJPEG(const uint8_t* const data, size_t data_size,
             WebPPicture* const pic, int keep_alpha,
             Metadata* const metadata) {
  volatile int ok = 0;
  int width, height;
  int64_t stride;
  volatile struct jpeg_decompress_struct dinfo;
  struct my_error_mgr jerr;
  uint8_t* volatile rgb = NULL;
  JSAMPROW buffer[1];
  JPEGReadContext ctx;

  if (data == NULL || data_size == 0 || pic == NULL) return 0;

  (void)keep_alpha;
  memset(&ctx, 0, sizeof(ctx));
  ctx.data = data;
  ctx.data_size = data_size;

  memset((j_decompress_ptr)&dinfo, 0, sizeof(dinfo));   // for setjmp safety
  dinfo.err = jpeg_std_error(&jerr.pub);
  jerr.pub.error_exit = my_error_exit;

  if (setjmp(jerr.setjmp_buffer)) {
 Error:
    MetadataFree(metadata);
    jpeg_destroy_decompress((j_decompress_ptr)&dinfo);
    goto End;
  }

  jpeg_create_decompress((j_decompress_ptr)&dinfo);
  ContextSetup(&dinfo, &ctx);
  if (metadata != NULL) SaveMetadataMarkers((j_decompress_ptr)&dinfo);
  jpeg_read_header((j_decompress_ptr)&dinfo, TRUE);

  dinfo.out_color_space = JCS_RGB;
  dinfo.do_fancy_upsampling = TRUE;

  jpeg_start_decompress((j_decompress_ptr)&dinfo);

  if (dinfo.output_components != 3) {
    goto Error;
  }

  width = dinfo.output_width;
  height = dinfo.output_height;
  stride = (int64_t)dinfo.output_width * dinfo.output_components * sizeof(*rgb);

  if (stride != (int)stride ||
      !ImgIoUtilCheckSizeArgumentsOverflow(stride, height)) {
    goto Error;
  }

  rgb = (uint8_t*)malloc((size_t)stride * height);
  if (rgb == NULL) {
    goto Error;
  }
  buffer[0] = (JSAMPLE*)rgb;

  while (dinfo.output_scanline < dinfo.output_height) {
    if (jpeg_read_scanlines((j_decompress_ptr)&dinfo, buffer, 1) != 1) {
      goto Error;
    }
    buffer[0] += stride;
  }

  if (metadata != NULL) {
    ok = ExtractMetadataFromJPEG((j_decompress_ptr)&dinfo, metadata);
    if (!ok) {
      fprintf(stderr, "Error extracting JPEG metadata!\n");
      goto Error;
    }
  }

  jpeg_finish_decompress((j_decompress_ptr)&dinfo);
  jpeg_destroy_decompress((j_decompress_ptr)&dinfo);

  // WebP conversion.
  pic->width = width;
  pic->height = height;
  ok = WebPPictureImportRGB(pic, rgb, (int)stride);
  if (!ok) {
    pic->width = 0;   // WebPPictureImportRGB() barely touches 'pic' on failure.
    pic->height = 0;  // Just reset dimensions but keep any 'custom_ptr' etc.
    MetadataFree(metadata);  // In case the caller forgets to free it on error.
  }

 End:
  free(rgb);
  return ok;
}